

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

int __thiscall
diligent_spirv_cross::CompilerGLSL::get_constant_mapping_to_workgroup_component
          (CompilerGLSL *this,SPIRConstant *c)

{
  uint32_t uVar1;
  int iVar2;
  SPIREntryPoint *pSVar3;
  
  pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
  iVar2 = -1;
  if (((pSVar3->workgroup_size).constant == 0) && (((pSVar3->flags).lower & 0x4000000000) != 0)) {
    uVar1 = (c->super_IVariant).self.id;
    iVar2 = 0;
    if ((uVar1 != (pSVar3->workgroup_size).id_x) &&
       (iVar2 = 1, uVar1 != (pSVar3->workgroup_size).id_y)) {
      iVar2 = (uint)(uVar1 == (pSVar3->workgroup_size).id_z) * 3 + -1;
    }
  }
  return iVar2;
}

Assistant:

int CompilerGLSL::get_constant_mapping_to_workgroup_component(const SPIRConstant &c) const
{
	auto &entry_point = get_entry_point();
	int index = -1;

	// Need to redirect specialization constants which are used as WorkGroupSize to the builtin,
	// since the spec constant declarations are never explicitly declared.
	if (entry_point.workgroup_size.constant == 0 && entry_point.flags.get(ExecutionModeLocalSizeId))
	{
		if (c.self == entry_point.workgroup_size.id_x)
			index = 0;
		else if (c.self == entry_point.workgroup_size.id_y)
			index = 1;
		else if (c.self == entry_point.workgroup_size.id_z)
			index = 2;
	}

	return index;
}